

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_fft.cpp
# Opt level: O3

bool fft::RandomImageFFT(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint32_t width;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uchar *__s2;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Image input;
  Image output;
  Image diracDelta;
  ComplexData complexDataDracDelta;
  ComplexData complexDataInput;
  FFTExecutor fftExecutor;
  Image local_108;
  ulong local_e0;
  uchar *local_d8;
  Image local_d0;
  ImageTemplate<unsigned_char> local_a8;
  ComplexData local_80;
  ComplexData local_68;
  FFTExecutor local_50;
  
  bVar7 = false;
  uVar3 = 0;
  do {
    uVar1 = rand();
    width = 2 << (uVar1 - (uVar1 / 0xb + (uVar1 / 0xb) * 10) & 0x1f);
    Unit_Test::randomImage(&local_108,width,width);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&local_a8,local_108._width,local_108._height,'\x01','\x01');
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_a8,'\0');
    local_a8._data[(local_a8._width >> 1) + (local_a8._height >> 1) * local_a8._rowSize] = '\x01';
    FFT::ComplexData::ComplexData(&local_68,&local_108);
    FFT::ComplexData::ComplexData(&local_80,&local_a8);
    FFT::FFTExecutor::FFTExecutor(&local_50,local_108._width,local_108._height);
    FFT::FFTExecutor::directTransform(&local_50,&local_68);
    FFT::FFTExecutor::directTransform(&local_50,&local_80);
    FFT::FFTExecutor::complexMultiplication(&local_50,&local_68,&local_80,&local_68);
    FFT::FFTExecutor::inverseTransform(&local_50,&local_68);
    FFT::ComplexData::get(&local_d0,&local_68);
    if (((local_108._height == local_d0._height) && (local_108._width == local_d0._width)) &&
       (local_108._colorCount == local_d0._colorCount)) {
      uVar4 = (ulong)local_108._rowSize;
      uVar1 = local_108._height * local_108._rowSize;
      if (uVar1 == 0) {
        bVar8 = true;
      }
      else {
        uVar6 = local_108._width * local_108._colorCount;
        local_e0 = (ulong)local_d0._rowSize;
        local_d8 = local_108._data;
        lVar5 = 0;
        __s2 = local_d0._data;
        do {
          iVar2 = bcmp(local_d8 + lVar5,__s2,(ulong)uVar6);
          bVar8 = iVar2 == 0;
          if (!bVar8) break;
          __s2 = __s2 + local_e0;
          bVar9 = uVar1 - uVar4 != lVar5;
          lVar5 = lVar5 + uVar4;
        } while (bVar9);
      }
    }
    else {
      bVar8 = false;
    }
    local_d0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_d0);
    FFT::FFTExecutor::~FFTExecutor(&local_50);
    FFT::ComplexData::~ComplexData(&local_80);
    FFT::ComplexData::~ComplexData(&local_68);
    local_a8._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a8);
    local_108._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_108);
    if (!bVar8) {
      return bVar7;
    }
    bVar7 = 0x1e < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x20) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool RandomImageFFT()
    {
        for ( uint32_t i = 0u; i < 32u; ++i ) { // a special case for FFT because it take a lot of time for execution
            const uint32_t dimension = (2u << Unit_Test::randomValue<uint8_t>( 11 ));

            const PenguinV_Image::Image input = Unit_Test::randomImage( dimension, dimension );

            PenguinV_Image::Image diracDelta( input.width(), input.height() );
            diracDelta.fill( 0u );
            diracDelta.data()[diracDelta.height() / 2 * diracDelta.rowSize() + diracDelta.width() / 2 ] = 1u;

            FFT::ComplexData complexDataInput( input );
            FFT::ComplexData complexDataDracDelta( diracDelta );

            FFT::FFTExecutor fftExecutor( input.width(), input.height() );

            fftExecutor.directTransform( complexDataInput );
            fftExecutor.directTransform( complexDataDracDelta );
            fftExecutor.complexMultiplication( complexDataInput, complexDataDracDelta, complexDataInput );
            fftExecutor.inverseTransform( complexDataInput );

            const PenguinV_Image::Image output = complexDataInput.get();

            if( input.height() != output.height() || input.width() != output.width() || input.colorCount() != output.colorCount() )
                return false;

            const uint32_t rowSizeIn  = input.rowSize();
            const uint32_t rowSizeOut = output.rowSize();
            const uint32_t width = input.width() * input.colorCount();
            const uint8_t * inY  = input.data();
            const uint8_t * outY = output.data();
            const uint8_t * inYEnd = inY + rowSizeIn * input.height();

            for ( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                if ( memcmp( inY, outY, width ) != 0 )
                    return false;
            }
        }
        return true;
    }